

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_TestShell::
TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_TestShell
          (TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_TestShell *this)

{
  TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_TestShell_0035c090;
  return;
}

Assistant:

TEST(MockParameterTest, doubleParameterNotEqualIfOutsideTolerance)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", 100.0);
    MockNamedValue parameter("parameter");
    parameter.setValue(106.0);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock( ).expectOneCall("foo").withParameter("parameter", 100.0, 5.0);
    mock( ).actualCall("foo").withParameter("parameter", 106.0);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}